

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
glcts::(anonymous_namespace)::BasicAllTargetsLoadCS::Read<tcu::Vector<float,4>>
          (BasicAllTargetsLoadCS *this,int target,GLenum internalformat,Vector<float,_4> *value,
          Vector<float,_4> *expected_value,GLenum format,GLenum type)

{
  allocator<tcu::Vector<float,_4>_> *paVar1;
  byte bVar2;
  GLenum GVar3;
  Vector<float,_4> *__value;
  uint uVar4;
  GLuint GVar5;
  reference pvVar6;
  undefined8 uVar7;
  string local_180;
  int local_15c;
  Vector<float,_4> *pVStack_158;
  int layers;
  Vector<float,_4> *map_data;
  GLuint local_148;
  GLuint GStack_144;
  bool status;
  GLuint m_buffer [4];
  allocator<tcu::Vector<float,_4>_> local_129;
  undefined1 local_128 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> out_data2DArray;
  undefined1 local_108 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> out_dataCube;
  undefined1 local_e8 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> out_data3D;
  undefined1 local_c8 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> out_data2D;
  undefined1 local_a8 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> data;
  GLuint local_88;
  int kSize;
  GLuint textures [8];
  string local_50;
  GLuint local_30;
  GLenum local_2c;
  GLuint program;
  GLenum format_local;
  Vector<float,_4> *expected_value_local;
  Vector<float,_4> *value_local;
  GLenum internalformat_local;
  int target_local;
  BasicAllTargetsLoadCS *this_local;
  
  local_2c = format;
  _program = expected_value;
  expected_value_local = value;
  value_local._0_4_ = internalformat;
  value_local._4_4_ = target;
  _internalformat_local = this;
  GenCS<tcu::Vector<float,4>>(&local_50,this,target,internalformat,expected_value);
  GVar5 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::CreateComputeProgram
                    ((ShaderImageLoadStoreBase *)this,&local_50,false);
  std::__cxx11::string::~string((string *)&local_50);
  local_30 = GVar5;
  glu::CallLogWrapper::glGenTextures((CallLogWrapper *)(this + 8),8,&local_88);
  __value = expected_value_local;
  data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0xb;
  paVar1 = (allocator<tcu::Vector<float,_4>_> *)
           ((long)&out_data2D.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a8,0xf2
             ,__value,paVar1);
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)
             ((long)&out_data2D.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,kSize);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D
            ((CallLogWrapper *)(this + 8),0xde1,1,(GLenum)value_local,0xb,0xb);
  GVar3 = local_2c;
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_a8,0);
  glu::CallLogWrapper::glTexSubImage2D
            ((CallLogWrapper *)(this + 8),0xde1,0,0,0,0xb,0xb,GVar3,type,pvVar6);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x806f,textures[0]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x806f,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x806f,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage3D
            ((CallLogWrapper *)(this + 8),0x806f,1,(GLenum)value_local,0xb,0xb,2);
  GVar3 = local_2c;
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_a8,0);
  glu::CallLogWrapper::glTexSubImage3D
            ((CallLogWrapper *)(this + 8),0x806f,0,0,0,0,0xb,0xb,2,GVar3,type,pvVar6);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x806f,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8513,textures[2]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8513,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8513,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D
            ((CallLogWrapper *)(this + 8),0x8513,1,(GLenum)value_local,0xb,0xb);
  GVar3 = local_2c;
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_a8,0);
  glu::CallLogWrapper::glTexSubImage2D
            ((CallLogWrapper *)(this + 8),0x8516,0,0,0,0xb,0xb,GVar3,type,pvVar6);
  GVar3 = local_2c;
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_a8,0);
  glu::CallLogWrapper::glTexSubImage2D
            ((CallLogWrapper *)(this + 8),0x8515,0,0,0,0xb,0xb,GVar3,type,pvVar6);
  GVar3 = local_2c;
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_a8,0);
  glu::CallLogWrapper::glTexSubImage2D
            ((CallLogWrapper *)(this + 8),0x8518,0,0,0,0xb,0xb,GVar3,type,pvVar6);
  GVar3 = local_2c;
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_a8,0);
  glu::CallLogWrapper::glTexSubImage2D
            ((CallLogWrapper *)(this + 8),0x8517,0,0,0,0xb,0xb,GVar3,type,pvVar6);
  GVar3 = local_2c;
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_a8,0);
  glu::CallLogWrapper::glTexSubImage2D
            ((CallLogWrapper *)(this + 8),0x851a,0,0,0,0xb,0xb,GVar3,type,pvVar6);
  GVar3 = local_2c;
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_a8,0);
  glu::CallLogWrapper::glTexSubImage2D
            ((CallLogWrapper *)(this + 8),0x8519,0,0,0,0xb,0xb,GVar3,type,pvVar6);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8513,0);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,textures[5]);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage3D
            ((CallLogWrapper *)(this + 8),0x8c1a,1,(GLenum)value_local,0xb,0xb,2);
  GVar3 = local_2c;
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_a8,0);
  glu::CallLogWrapper::glTexSubImage3D
            ((CallLogWrapper *)(this + 8),0x8c1a,0,0,0,0,0xb,0xb,2,GVar3,type,pvVar6);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0x8c1a,0);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),2,kSize,0,'\0',0,35000,(GLenum)value_local);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),0,textures[0],0,'\x01',0,35000,(GLenum)value_local);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),3,textures[2],0,'\x01',0,35000,(GLenum)value_local);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),1,textures[5],0,'\x01',0,35000,(GLenum)value_local);
  paVar1 = (allocator<tcu::Vector<float,_4>_> *)
           ((long)&out_data3D.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_c8,
             0x2d6,paVar1);
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)
             ((long)&out_data3D.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<tcu::Vector<float,_4>_> *)
           ((long)&out_dataCube.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_e8,
             0x2d6,paVar1);
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)
             ((long)&out_dataCube.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  paVar1 = (allocator<tcu::Vector<float,_4>_> *)
           ((long)&out_data2DArray.
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_108,
             0x2d6,paVar1);
  std::allocator<tcu::Vector<float,_4>_>::~allocator
            ((allocator<tcu::Vector<float,_4>_> *)
             ((long)&out_data2DArray.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_129);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_128,
             0x2d6,&local_129);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_129);
  glu::CallLogWrapper::glGenBuffers((CallLogWrapper *)(this + 8),4,&local_148);
  glu::CallLogWrapper::glBindBufferBase((CallLogWrapper *)(this + 8),0x90d2,0,local_148);
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_108,0);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)(this + 8),0x90d2,0x2d60,pvVar6,0x88e4);
  glu::CallLogWrapper::glBindBufferBase((CallLogWrapper *)(this + 8),0x90d2,1,GStack_144);
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_108,0);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)(this + 8),0x90d2,0x2d60,pvVar6,0x88e4);
  glu::CallLogWrapper::glBindBufferBase((CallLogWrapper *)(this + 8),0x90d2,2,m_buffer[0]);
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_108,0);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)(this + 8),0x90d2,0x2d60,pvVar6,0x88e4);
  glu::CallLogWrapper::glBindBufferBase((CallLogWrapper *)(this + 8),0x90d2,3,m_buffer[1]);
  pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                     ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_108,0);
  glu::CallLogWrapper::glBufferData((CallLogWrapper *)(this + 8),0x90d2,0x2d60,pvVar6,0x88e4);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),local_30);
  glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)(this + 8),1,1,1);
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x200);
  map_data._7_1_ = 1;
  glu::CallLogWrapper::glBindBuffer
            ((CallLogWrapper *)(this + 8),0x90d2,(&local_148)[(int)value_local._4_4_]);
  pVStack_158 = (Vector<float,_4> *)
                glu::CallLogWrapper::glMapBufferRange
                          ((CallLogWrapper *)(this + 8),0x90d2,0,0x2d60,1);
  local_15c = 2;
  if (value_local._4_4_ == 0) {
    local_15c = 1;
  }
  if (value_local._4_4_ == 2) {
    local_15c = 6;
  }
  map_data._7_1_ =
       ShaderImageLoadStoreBase::CompareValues<tcu::Vector<float,4>>
                 ((ShaderImageLoadStoreBase *)this,pVStack_158,0xb,_program,(GLenum)value_local,
                  local_15c);
  uVar4 = value_local._4_4_;
  if (!(bool)map_data._7_1_) {
    ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
              (&local_180,(ShaderImageLoadStoreBase *)this,(GLenum)value_local);
    uVar7 = std::__cxx11::string::c_str();
    glcts::anon_unknown_0::Output("%d target, %s format failed. \n",(ulong)uVar4,uVar7);
    std::__cxx11::string::~string((string *)&local_180);
  }
  glu::CallLogWrapper::glUnmapBuffer((CallLogWrapper *)(this + 8),0x90d2);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)(this + 8),0);
  glu::CallLogWrapper::glDeleteProgram((CallLogWrapper *)(this + 8),local_30);
  glu::CallLogWrapper::glDeleteTextures((CallLogWrapper *)(this + 8),8,&local_88);
  glu::CallLogWrapper::glDeleteBuffers((CallLogWrapper *)(this + 8),4,&local_148);
  bVar2 = map_data._7_1_;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_128);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_108);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_e8);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_c8);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_a8);
  return (bool)(bVar2 & 1);
}

Assistant:

bool Read(int target, GLenum internalformat, const T& value, const T& expected_value, GLenum format, GLenum type)
	{
		const GLuint program = CreateComputeProgram(GenCS(target, internalformat, expected_value));
		GLuint		 textures[8];
		glGenTextures(8, textures);

		const int	  kSize = 11;
		std::vector<T> data(kSize * kSize * 2, value);

		glBindTexture(GL_TEXTURE_2D, textures[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
		glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindTexture(GL_TEXTURE_3D, textures[2]);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage3D(GL_TEXTURE_3D, 1, internalformat, kSize, kSize, 2);
		glTexSubImage3D(GL_TEXTURE_3D, 0, 0, 0, 0, kSize, kSize, 2, format, type, &data[0]);
		glBindTexture(GL_TEXTURE_3D, 0);

		glBindTexture(GL_TEXTURE_CUBE_MAP, textures[4]);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_CUBE_MAP, 1, internalformat, kSize, kSize);
		glTexSubImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_X, 0, 0, 0, kSize, kSize, format, type, &data[0]);
		glTexSubImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X, 0, 0, 0, kSize, kSize, format, type, &data[0]);
		glTexSubImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y, 0, 0, 0, kSize, kSize, format, type, &data[0]);
		glTexSubImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Y, 0, 0, 0, kSize, kSize, format, type, &data[0]);
		glTexSubImage2D(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z, 0, 0, 0, kSize, kSize, format, type, &data[0]);
		glTexSubImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_Z, 0, 0, 0, kSize, kSize, format, type, &data[0]);
		glBindTexture(GL_TEXTURE_CUBE_MAP, 0);

		glBindTexture(GL_TEXTURE_2D_ARRAY, textures[7]);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage3D(GL_TEXTURE_2D_ARRAY, 1, internalformat, kSize, kSize, 2);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, kSize, kSize, 2, format, type, &data[0]);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		glBindImageTexture(2, textures[1], 0, GL_FALSE, 0, GL_READ_ONLY, internalformat); // 2D
		glBindImageTexture(0, textures[2], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);  // 3D
		glBindImageTexture(3, textures[4], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);  // Cube
		glBindImageTexture(1, textures[7], 0, GL_TRUE, 0, GL_READ_ONLY, internalformat);  // 2DArray

		std::vector<T> out_data2D(kSize * kSize * 6);
		std::vector<T> out_data3D(kSize * kSize * 6);
		std::vector<T> out_dataCube(kSize * kSize * 6);
		std::vector<T> out_data2DArray(kSize * kSize * 6);
		GLuint		   m_buffer[4];
		glGenBuffers(4, m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[0]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 6 * kSize * kSize * 4 * 4, &out_dataCube[0], GL_STATIC_DRAW);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[1]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 6 * kSize * kSize * 4 * 4, &out_dataCube[0], GL_STATIC_DRAW);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_buffer[2]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 6 * kSize * kSize * 4 * 4, &out_dataCube[0], GL_STATIC_DRAW);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_buffer[3]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 6 * kSize * kSize * 4 * 4, &out_dataCube[0], GL_STATIC_DRAW);

		glUseProgram(program);
		glDispatchCompute(1, 1, 1);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		bool status = true;

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_buffer[target]);
		T*  map_data = (T*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, 6 * kSize * kSize * 4 * 4, GL_MAP_READ_BIT);
		int layers   = 2;
		if (target == T2D)
			layers = 1;
		if (target == TCM)
			layers = 6;
		status	 = CompareValues(map_data, kSize, expected_value, internalformat, layers);
		if (!status)
			Output("%d target, %s format failed. \n", target, FormatEnumToString(internalformat).c_str());
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);

		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteTextures(8, textures);
		glDeleteBuffers(4, m_buffer);

		return status;
	}